

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdialog.cpp
# Opt level: O2

void __thiscall
QInputDialogDoubleSpinBox::keyPressEvent(QInputDialogDoubleSpinBox *this,QKeyEvent *event)

{
  bool bVar1;
  long in_FS_OFFSET;
  QVariant local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(uint *)(event + 0x40) & 0xfffffffe) == 0x1000004) {
    bVar1 = QAbstractSpinBox::hasAcceptableInput((QAbstractSpinBox *)this);
    if (!bVar1) {
      QObject::property((char *)&local_40);
      QObject::setProperty((QObject *)this,"value",&local_40);
      ::QVariant::~QVariant(&local_40);
      goto LAB_004b8287;
    }
  }
  QAbstractSpinBox::keyPressEvent((QAbstractSpinBox *)this,event);
LAB_004b8287:
  notifyTextChanged(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void keyPressEvent(QKeyEvent *event) override {
        if ((event->key() == Qt::Key_Return || event->key() == Qt::Key_Enter) && !hasAcceptableInput()) {
            setProperty("value", property("value"));
        } else {
            QDoubleSpinBox::keyPressEvent(event);
        }
        notifyTextChanged();
    }